

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O3

void float32_suite::test_minus_two(void)

{
  return_type *prVar1;
  value_type input [5];
  decoder decoder;
  return_type local_68 [2];
  uchar local_60 [8];
  decoder local_58;
  
  local_58.input._M_str = local_60;
  local_60[0] = 0xc5;
  local_60[1] = '\0';
  local_60[2] = '\0';
  local_60[3] = '\0';
  local_60[4] = 0xc0;
  local_58.input._M_len = 5;
  local_58.current.view._M_len = 0;
  local_58.current.view._M_str = (uchar *)0x0;
  local_58.current.code = end;
  trial::protocol::bintoken::detail::decoder::next(&local_58);
  local_68[0] = (return_type)local_58.current.code;
  prVar1 = local_68 + 1;
  local_68[1] = 2.76056e-43;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("decoder.code()","token::code::float32",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x2a7,"void float32_suite::test_minus_two()",local_68,prVar1);
  local_68[0] = trial::protocol::bintoken::detail::decoder::
                overloader<trial::protocol::bintoken::token::float32>::decode(&local_58);
  local_68[1] = -2.0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,float,float>
            ("decoder.value<token::float32>()","-2.0f",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x2a8,"void float32_suite::test_minus_two()",local_68,prVar1);
  trial::protocol::bintoken::detail::decoder::next(&local_58);
  local_68[0] = (return_type)local_58.current.code;
  local_68[1] = 0.0;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("decoder.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x2aa,"void float32_suite::test_minus_two()",local_68,prVar1);
  return;
}

Assistant:

void test_minus_two()
{
    const value_type input[] = { token::code::float32, 0x00, 0x00, 0x00, 0xC0 };
    format::detail::decoder decoder(input);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::float32);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.value<token::float32>(), -2.0f);
    decoder.next();
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::end);
}